

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeGCData
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literals *data
          ,Type type)

{
  element_type *this_00;
  HeapType HVar1;
  HeapType local_58;
  Type local_50;
  Type type_local;
  shared_ptr<wasm::GCData> allocation;
  undefined1 local_21;
  
  local_50.id = type.id;
  local_58 = Type::getHeapType(&local_50);
  type_local.id = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&allocation,(GCData **)&type_local,
             (allocator<wasm::GCData> *)&local_21,&local_58,data);
  this_00 = allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type_local.id;
  if (allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (int)((allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                values).super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
      UNLOCK();
    }
    else {
      *(int *)&((allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (int)((allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                values).super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
    }
  }
  HVar1 = Type::getHeapType(&local_50);
  ::wasm::Literal::Literal
            (__return_storage_ptr__,
             &allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             HVar1.id);
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal makeGCData(Literals&& data, Type type) {
    auto allocation =
      std::make_shared<GCData>(type.getHeapType(), std::move(data));
#if __has_feature(leak_sanitizer) || __has_feature(address_sanitizer)
    // GC data with cycles will leak, since shared_ptrs do not handle cycles.
    // Binaryen is generally not used in long-running programs so we just ignore
    // such leaks for now.
    // TODO: Add a cycle collector?
    __lsan_ignore_object(allocation.get());
#endif
    return Literal(allocation, type.getHeapType());
  }